

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addLagrangeTerm
          (OptimalControlProblem *this,double weight,
          shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *quadraticCost)

{
  OptimalControlProblemPimpl *this_00;
  bool bVar1;
  allocator<char> local_61;
  double local_60;
  shared_ptr<iDynTree::optimalcontrol::Cost> local_58;
  string local_48;
  TimeRange local_28;
  
  this_00 = this->m_pimpl;
  local_60 = weight;
  TimeRange::AnyTime();
  std::__shared_ptr<iDynTree::optimalcontrol::Cost,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<iDynTree::optimalcontrol::QuadraticCost,void>
            ((__shared_ptr<iDynTree::optimalcontrol::Cost,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &quadraticCost->
              super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"addLagrangeTerm",&local_61);
  bVar1 = OptimalControlProblemPimpl::addCost
                    (this_00,local_60,&local_28,&local_58,false,true,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.
              super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar1;
}

Assistant:

bool OptimalControlProblem::addLagrangeTerm(double weight, std::shared_ptr<QuadraticCost> quadraticCost)
        {
            return (m_pimpl->addCost(weight, TimeRange::AnyTime(), quadraticCost, false, true, "addLagrangeTerm"));
        }